

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.cpp
# Opt level: O3

ssize_t __thiscall FileManager::write(FileManager *this,int __fd,void *__buf,size_t __n)

{
  element_type *peVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  
  peVar1 = (this->activeFile).super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar2 = (*peVar1->_vptr_AssemblerFile[4])();
    if ((char)iVar2 != '\0') {
      peVar1 = (this->activeFile).super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      iVar2 = (*peVar1->_vptr_AssemblerFile[5])(peVar1,CONCAT44(in_register_00000034,__fd),__buf);
      return CONCAT44(extraout_var,iVar2);
    }
  }
  Logger::queueError<>(Error,"No file opened");
  return 0;
}

Assistant:

bool FileManager::write(void* data, size_t length)
{
	if (!checkActiveFile())
		return false;

	if (!activeFile->isOpen())
	{
		Logger::queueError(Logger::Error, "No file opened");
		return false;
	}

	return activeFile->write(data,length);
}